

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::InitProtobufDefaults(void)

{
  int iVar1;
  
  if (InitProtobufDefaults()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaults()::is_inited);
    if (iVar1 != 0) {
      fixed_address_empty_string_abi_cxx11_ = &DAT_00472138;
      DAT_00472130 = 0;
      DAT_00472138 = 0;
      OnShutdownRun(DestroyString,&fixed_address_empty_string_abi_cxx11_);
      __cxa_guard_release(&InitProtobufDefaults()::is_inited);
      return;
    }
  }
  return;
}

Assistant:

void InitProtobufDefaults() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}